

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2D.cpp
# Opt level: O3

void __thiscall EnvironmentNAV2D::Computedxy(EnvironmentNAV2D *this)

{
  int dind;
  ulong uVar1;
  
  (this->EnvNAV2DCfg).dxintersects_[0] = (int  [2])0x100000000;
  (this->EnvNAV2DCfg).dxintersects_[1] = (int  [2])0x0;
  (this->EnvNAV2DCfg).dyintersects_[0] = (int  [2])0x1;
  (this->EnvNAV2DCfg).dyintersects_[1] = (int  [2])0x0;
  (this->EnvNAV2DCfg).dx_[0] = 1;
  (this->EnvNAV2DCfg).dx_[1] = 1;
  (this->EnvNAV2DCfg).dx_[2] = 1;
  (this->EnvNAV2DCfg).dx_[3] = 0;
  (this->EnvNAV2DCfg).dy_[0] = 1;
  (this->EnvNAV2DCfg).dy_[1] = 0;
  (this->EnvNAV2DCfg).dy_[2] = -1;
  (this->EnvNAV2DCfg).dy_[3] = 1;
  (this->EnvNAV2DCfg).dxintersects_[2] = (int  [2])0x100000000;
  (this->EnvNAV2DCfg).dxintersects_[3] = (int  [2])0x0;
  (this->EnvNAV2DCfg).dyintersects_[2] = (int  [2])0xffffffff;
  (this->EnvNAV2DCfg).dyintersects_[3] = (int  [2])0x0;
  (this->EnvNAV2DCfg).dxintersects_[4] = (int  [2])0x0;
  (this->EnvNAV2DCfg).dxintersects_[5] = (int  [2])0xffffffff00000000;
  (this->EnvNAV2DCfg).dyintersects_[4] = (int  [2])0x0;
  (this->EnvNAV2DCfg).dyintersects_[5] = (int  [2])0x1;
  (this->EnvNAV2DCfg).dx_[4] = 0;
  (this->EnvNAV2DCfg).dx_[5] = -1;
  (this->EnvNAV2DCfg).dx_[6] = -1;
  (this->EnvNAV2DCfg).dx_[7] = -1;
  (this->EnvNAV2DCfg).dy_[4] = -1;
  (this->EnvNAV2DCfg).dy_[5] = 1;
  (this->EnvNAV2DCfg).dy_[6] = 0;
  (this->EnvNAV2DCfg).dy_[7] = -1;
  (this->EnvNAV2DCfg).dxintersects_[6] = (int  [2])0x0;
  (this->EnvNAV2DCfg).dxintersects_[7] = (int  [2])0xffffffff00000000;
  (this->EnvNAV2DCfg).dyintersects_[6] = (int  [2])0x0;
  (this->EnvNAV2DCfg).dyintersects_[7] = (int  [2])0xffffffff;
  (this->EnvNAV2DCfg).dxintersects_[8] = (int  [2])0x100000001;
  (this->EnvNAV2DCfg).dxintersects_[9] = (int  [2])0x100000000;
  (this->EnvNAV2DCfg).dyintersects_[8] = (int  [2])0x100000000;
  (this->EnvNAV2DCfg).dyintersects_[9] = (int  [2])0x100000001;
  (this->EnvNAV2DCfg).dx_[8] = 2;
  (this->EnvNAV2DCfg).dx_[9] = 1;
  (this->EnvNAV2DCfg).dx_[10] = -1;
  (this->EnvNAV2DCfg).dx_[0xb] = -2;
  (this->EnvNAV2DCfg).dy_[8] = 1;
  (this->EnvNAV2DCfg).dy_[9] = 2;
  (this->EnvNAV2DCfg).dy_[10] = 2;
  (this->EnvNAV2DCfg).dy_[0xb] = 1;
  (this->EnvNAV2DCfg).dxintersects_[10] = (int  [2])0xffffffff00000000;
  (this->EnvNAV2DCfg).dxintersects_[0xb] = (int  [2])0xffffffffffffffff;
  (this->EnvNAV2DCfg).dyintersects_[10] = (int  [2])0x100000001;
  (this->EnvNAV2DCfg).dyintersects_[0xb] = (int  [2])0x100000000;
  (this->EnvNAV2DCfg).dxintersects_[0xc] = (int  [2])0xffffffffffffffff;
  (this->EnvNAV2DCfg).dxintersects_[0xd] = (int  [2])0xffffffff00000000;
  (this->EnvNAV2DCfg).dyintersects_[0xc] = (int  [2])0xffffffff00000000;
  (this->EnvNAV2DCfg).dyintersects_[0xd] = (int  [2])0xffffffffffffffff;
  (this->EnvNAV2DCfg).dx_[0xc] = -2;
  (this->EnvNAV2DCfg).dx_[0xd] = -1;
  (this->EnvNAV2DCfg).dx_[0xe] = 1;
  (this->EnvNAV2DCfg).dx_[0xf] = 2;
  (this->EnvNAV2DCfg).dy_[0xc] = -1;
  (this->EnvNAV2DCfg).dy_[0xd] = -2;
  (this->EnvNAV2DCfg).dy_[0xe] = -2;
  (this->EnvNAV2DCfg).dy_[0xf] = -1;
  (this->EnvNAV2DCfg).dxintersects_[0xe] = (int  [2])0x100000000;
  (this->EnvNAV2DCfg).dxintersects_[0xf] = (int  [2])0x100000001;
  (this->EnvNAV2DCfg).dyintersects_[0xe] = (int  [2])0xffffffffffffffff;
  (this->EnvNAV2DCfg).dyintersects_[0xf] = (int  [2])0xffffffff00000000;
  uVar1 = 0;
  do {
    if (((this->EnvNAV2DCfg).dx_[uVar1] == 0) || ((this->EnvNAV2DCfg).dy_[uVar1] == 0)) {
      (this->EnvNAV2DCfg).dxy_distance_mm_[uVar1] = 1000;
    }
    else if (uVar1 < 8) {
      (this->EnvNAV2DCfg).dxy_distance_mm_[uVar1] = 0x586;
    }
    else {
      (this->EnvNAV2DCfg).dxy_distance_mm_[uVar1] = 0x8bc;
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x10);
  return;
}

Assistant:

void EnvironmentNAV2D::Computedxy()
{
    //initialize some constants for 2D search
    EnvNAV2DCfg.dx_[0] = 1;
    EnvNAV2DCfg.dy_[0] = 1;
    EnvNAV2DCfg.dxintersects_[0][0] = 0;
    EnvNAV2DCfg.dyintersects_[0][0] = 1;
    EnvNAV2DCfg.dxintersects_[0][1] = 1;
    EnvNAV2DCfg.dyintersects_[0][1] = 0;

    EnvNAV2DCfg.dx_[1] = 1;
    EnvNAV2DCfg.dy_[1] = 0;
    EnvNAV2DCfg.dxintersects_[1][0] = 0;
    EnvNAV2DCfg.dyintersects_[1][0] = 0;
    EnvNAV2DCfg.dxintersects_[1][1] = 0;
    EnvNAV2DCfg.dyintersects_[1][1] = 0;

    EnvNAV2DCfg.dx_[2] = 1;
    EnvNAV2DCfg.dy_[2] = -1;
    EnvNAV2DCfg.dxintersects_[2][0] = 0;
    EnvNAV2DCfg.dyintersects_[2][0] = -1;
    EnvNAV2DCfg.dxintersects_[2][1] = 1;
    EnvNAV2DCfg.dyintersects_[2][1] = 0;

    EnvNAV2DCfg.dx_[3] = 0;
    EnvNAV2DCfg.dy_[3] = 1;
    EnvNAV2DCfg.dxintersects_[3][0] = 0;
    EnvNAV2DCfg.dyintersects_[3][0] = 0;
    EnvNAV2DCfg.dxintersects_[3][1] = 0;
    EnvNAV2DCfg.dyintersects_[3][1] = 0;

    EnvNAV2DCfg.dx_[4] = 0;
    EnvNAV2DCfg.dy_[4] = -1;
    EnvNAV2DCfg.dxintersects_[4][0] = 0;
    EnvNAV2DCfg.dyintersects_[4][0] = 0;
    EnvNAV2DCfg.dxintersects_[4][1] = 0;
    EnvNAV2DCfg.dyintersects_[4][1] = 0;

    EnvNAV2DCfg.dx_[5] = -1;
    EnvNAV2DCfg.dy_[5] = 1;
    EnvNAV2DCfg.dxintersects_[5][0] = 0;
    EnvNAV2DCfg.dyintersects_[5][0] = 1;
    EnvNAV2DCfg.dxintersects_[5][1] = -1;
    EnvNAV2DCfg.dyintersects_[5][1] = 0;

    EnvNAV2DCfg.dx_[6] = -1;
    EnvNAV2DCfg.dy_[6] = 0;
    EnvNAV2DCfg.dxintersects_[6][0] = 0;
    EnvNAV2DCfg.dyintersects_[6][0] = 0;
    EnvNAV2DCfg.dxintersects_[6][1] = 0;
    EnvNAV2DCfg.dyintersects_[6][1] = 0;

    EnvNAV2DCfg.dx_[7] = -1;
    EnvNAV2DCfg.dy_[7] = -1;
    EnvNAV2DCfg.dxintersects_[7][0] = 0;
    EnvNAV2DCfg.dyintersects_[7][0] = -1;
    EnvNAV2DCfg.dxintersects_[7][1] = -1;
    EnvNAV2DCfg.dyintersects_[7][1] = 0;

    //Note: these actions have to be starting at 8 and through 15, since they
    //get multiplied correspondingly in Dijkstra's search based on index
    EnvNAV2DCfg.dx_[8] = 2;
    EnvNAV2DCfg.dy_[8] = 1;
    EnvNAV2DCfg.dxintersects_[8][0] = 1;
    EnvNAV2DCfg.dyintersects_[8][0] = 0;
    EnvNAV2DCfg.dxintersects_[8][1] = 1;
    EnvNAV2DCfg.dyintersects_[8][1] = 1;

    EnvNAV2DCfg.dx_[9] = 1;
    EnvNAV2DCfg.dy_[9] = 2;
    EnvNAV2DCfg.dxintersects_[9][0] = 0;
    EnvNAV2DCfg.dyintersects_[9][0] = 1;
    EnvNAV2DCfg.dxintersects_[9][1] = 1;
    EnvNAV2DCfg.dyintersects_[9][1] = 1;

    EnvNAV2DCfg.dx_[10] = -1;
    EnvNAV2DCfg.dy_[10] = 2;
    EnvNAV2DCfg.dxintersects_[10][0] = 0;
    EnvNAV2DCfg.dyintersects_[10][0] = 1;
    EnvNAV2DCfg.dxintersects_[10][1] = -1;
    EnvNAV2DCfg.dyintersects_[10][1] = 1;

    EnvNAV2DCfg.dx_[11] = -2;
    EnvNAV2DCfg.dy_[11] = 1;
    EnvNAV2DCfg.dxintersects_[11][0] = -1;
    EnvNAV2DCfg.dyintersects_[11][0] = 0;
    EnvNAV2DCfg.dxintersects_[11][1] = -1;
    EnvNAV2DCfg.dyintersects_[11][1] = 1;

    EnvNAV2DCfg.dx_[12] = -2;
    EnvNAV2DCfg.dy_[12] = -1;
    EnvNAV2DCfg.dxintersects_[12][0] = -1;
    EnvNAV2DCfg.dyintersects_[12][0] = 0;
    EnvNAV2DCfg.dxintersects_[12][1] = -1;
    EnvNAV2DCfg.dyintersects_[12][1] = -1;

    EnvNAV2DCfg.dx_[13] = -1;
    EnvNAV2DCfg.dy_[13] = -2;
    EnvNAV2DCfg.dxintersects_[13][0] = 0;
    EnvNAV2DCfg.dyintersects_[13][0] = -1;
    EnvNAV2DCfg.dxintersects_[13][1] = -1;
    EnvNAV2DCfg.dyintersects_[13][1] = -1;

    EnvNAV2DCfg.dx_[14] = 1;
    EnvNAV2DCfg.dy_[14] = -2;
    EnvNAV2DCfg.dxintersects_[14][0] = 0;
    EnvNAV2DCfg.dyintersects_[14][0] = -1;
    EnvNAV2DCfg.dxintersects_[14][1] = 1;
    EnvNAV2DCfg.dyintersects_[14][1] = -1;

    EnvNAV2DCfg.dx_[15] = 2;
    EnvNAV2DCfg.dy_[15] = -1;
    EnvNAV2DCfg.dxintersects_[15][0] = 1;
    EnvNAV2DCfg.dyintersects_[15][0] = 0;
    EnvNAV2DCfg.dxintersects_[15][1] = 1;
    EnvNAV2DCfg.dyintersects_[15][1] = -1;

    //compute distances
    for (int dind = 0; dind < ENVNAV2D_MAXDIRS; dind++) {
        if (EnvNAV2DCfg.dx_[dind] != 0 && EnvNAV2DCfg.dy_[dind] != 0) {
            if (dind <= 7)
                //the cost of a diagonal move in millimeters
                EnvNAV2DCfg.dxy_distance_mm_[dind] = (int)ceil(ENVNAV2D_COSTMULT * 1.414);
            else
                //the cost of a move to 1,2 or 2,1 or so on in millimeters
                EnvNAV2DCfg.dxy_distance_mm_[dind] = (int)ceil(ENVNAV2D_COSTMULT * 2.236);
        }
        else
            EnvNAV2DCfg.dxy_distance_mm_[dind] = ENVNAV2D_COSTMULT; //the cost of a horizontal move in millimeters
    }
}